

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbwindow.cpp
# Opt level: O0

void __thiscall QXcbWindow::setImageFormatForVisual(QXcbWindow *this,xcb_visualtype_t *visual)

{
  int iVar1;
  bool bVar2;
  char *in_RSI;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff98;
  int line;
  QMessageLogger *this_00;
  Format *in_stack_ffffffffffffffb8;
  xcb_visualtype_t *in_stack_ffffffffffffffc0;
  uint8_t in_stack_ffffffffffffffcf;
  QXcbConnection *in_stack_ffffffffffffffd0;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QXcbObject::connection((QXcbObject *)&(in_RDI->context).function);
  bVar2 = qt_xcb_imageFormatForVisual
                    (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc0,
                     in_stack_ffffffffffffffb8,(bool *)this_00);
  if (!bVar2) {
    iVar1 = in_RDI[2].context.line;
    line = (int)((ulong)in_RDI >> 0x20);
    if (iVar1 == 0x10) {
      QMessageLogger::QMessageLogger
                (this_00,in_RSI,line,(char *)CONCAT44(0x10,in_stack_ffffffffffffff98));
      QMessageLogger::warning
                (&stack0xffffffffffffffb8,
                 "Using RGB16 fallback, if this works your X11 server is reporting a bad screen format."
                );
      *(undefined4 *)&in_RDI[2].context.file = 7;
    }
    else if ((iVar1 == 0x18) || (iVar1 == 0x20)) {
      QMessageLogger::QMessageLogger
                (this_00,in_RSI,line,(char *)CONCAT44(iVar1,in_stack_ffffffffffffff98));
      QMessageLogger::warning
                (local_28,
                 "Using RGB32 fallback, if this works your X11 server is reporting a bad screen format."
                );
      *(undefined4 *)&in_RDI[2].context.file = 4;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QXcbWindow::setImageFormatForVisual(const xcb_visualtype_t *visual)
{
    if (qt_xcb_imageFormatForVisual(connection(), m_depth, visual, &m_imageFormat, &m_imageRgbSwap))
        return;

    switch (m_depth) {
    case 32:
    case 24:
        qWarning("Using RGB32 fallback, if this works your X11 server is reporting a bad screen format.");
        m_imageFormat = QImage::Format_RGB32;
        break;
    case 16:
        qWarning("Using RGB16 fallback, if this works your X11 server is reporting a bad screen format.");
        m_imageFormat = QImage::Format_RGB16;
        break;
    default:
        break;
    }
}